

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamfilters.h
# Opt level: O0

void __thiscall
embree::LineCommentFilter::LineCommentFilter
          (LineCommentFilter *this,FileName *fileName,string *lineComment)

{
  long *plVar1;
  void *pvVar2;
  string *in_RDX;
  undefined8 *in_RDI;
  FileStream *in_stack_00000050;
  Stream<int> *in_stack_ffffffffffffffc0;
  
  Stream<int>::Stream(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__LineCommentFilter_005fd078;
  plVar1 = in_RDI + 8;
  pvVar2 = ::operator_new(0x270);
  FileStream::FileStream(in_stack_00000050,(FileName *)this);
  *plVar1 = (long)pvVar2;
  if (*plVar1 != 0) {
    (**(code **)(*(long *)*plVar1 + 0x10))();
  }
  std::__cxx11::string::string((string *)(in_RDI + 9),in_RDX);
  return;
}

Assistant:

LineCommentFilter (const FileName& fileName, const std::string& lineComment)
      : cin(new FileStream(fileName)), lineComment(lineComment) {}